

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O3

void __thiscall PatternGridHeader::paintEvent(PatternGridHeader *this,QPaintEvent *evt)

{
  QRect *pQVar1;
  int *piVar2;
  ColorGroup CVar3;
  int iVar4;
  long *plVar5;
  undefined4 extraout_var;
  int iVar6;
  ulong uVar7;
  QColor *color;
  ulong uVar8;
  QPainter painter;
  QPen textPen;
  QColor widgetbg;
  undefined1 auStack_e8 [12];
  int iStack_dc;
  int local_d8;
  int local_d4;
  int local_c8;
  int local_c4;
  QColor *local_c0;
  PatternGridHeader *local_b8;
  undefined8 local_b0;
  QPen local_a8 [8];
  int local_a0;
  int local_9c;
  QColor *local_98;
  QPen *local_90;
  QArrayData *local_88;
  char16_t *local_80;
  undefined8 local_78;
  int local_70 [3];
  undefined4 local_64;
  ulong local_60;
  QColor *local_58;
  ulong local_50;
  QColor local_48;
  
  if (this->mLayout != (PatternLayout *)0x0) {
    QPainter::QPainter((QPainter *)auStack_e8,(QPaintDevice *)&this->field_0x10);
    local_c0 = &this->mColorForeground1;
    QPen::QPen(local_a8,local_c0);
    CVar3 = QWidget::palette();
    QWidget::backgroundRole();
    plVar5 = (long *)QPalette::brush(CVar3,Dark);
    local_48._0_8_ = *(undefined8 *)(*plVar5 + 8);
    local_48._8_8_ = *(undefined8 *)(*plVar5 + 0x10);
    iVar6 = *(int *)(*(long *)&this->field_0x20 + 0x20) -
            *(int *)(*(long *)&this->field_0x20 + 0x18);
    iVar4 = PatternLayout::patternStart(this->mLayout);
    uVar7 = (ulong)(iVar6 + 1);
    iVar4 = iVar4 + -1;
    local_90 = &this->mLinePen;
    local_58 = &this->mColorBackground;
    local_a0 = iVar6 + -1;
    local_98 = &this->mColorForeground2;
    uVar8 = 0;
    pQVar1 = (QRect *)(auStack_e8 + 8);
    local_b8 = this;
    local_9c = iVar6;
    local_60 = uVar7;
    do {
      iVar6 = PatternLayout::trackWidth(this->mLayout,(int)uVar8);
      local_b0 = CONCAT44(extraout_var,iVar6);
      QPainter::setPen((QPen *)auStack_e8);
      iStack_dc = 0;
      local_d4 = (int)uVar7;
      auStack_e8._8_4_ = iVar4;
      local_d8 = iVar4;
      QPainter::drawLines((QLine *)auStack_e8,(int)pQVar1);
      auStack_e8._8_4_ = iVar4 + 2;
      iStack_dc = 0;
      local_d8 = (int)local_b0 + iVar4;
      local_d4 = local_9c;
      QPainter::fillRect((QRect *)auStack_e8,(QColor *)pQVar1);
      auStack_e8._8_4_ = iVar4 + 4;
      iStack_dc = 2;
      local_d8 = iVar4 + -2 + (int)local_b0;
      local_d4 = 5;
      local_c8 = auStack_e8._8_4_;
      local_c4 = local_d8;
      QPainter::fillRect((QRect *)auStack_e8,(QColor *)pQVar1);
      color = local_c0;
      if (uVar8 == (uint)this->mTrackHover) {
        auStack_e8._8_4_ = local_c8;
        iStack_dc = local_a0;
        local_d8 = local_c4;
        local_d4 = local_a0;
        QPainter::fillRect((QRect *)auStack_e8,(QColor *)pQVar1);
        color = local_98;
        if (local_b8->mHoverKind != addEffect) {
          color = local_c0;
        }
      }
      local_50 = uVar8;
      iVar6 = PatternLayout::effectsVisible(local_b8->mLayout,(int)uVar8);
      if (iVar6 == 3) {
        color = &local_48;
      }
      PatternGridHeaderTU::drawPlus((QPainter *)auStack_e8,local_c8,color);
      auStack_e8._8_4_ = iVar4 + 6;
      iStack_dc = 0x1b;
      local_d8 = iVar4 + 0xd;
      local_d4 = 0x1c;
      QPainter::fillRect((QRect *)auStack_e8,(QColor *)pQVar1);
      QPainter::setPen((QPen *)auStack_e8);
      local_88 = (QArrayData *)0x0;
      local_80 = L"CH%1";
      local_78 = 4;
      uVar8 = local_50 + 1;
      QString::arg((longlong)pQVar1,(int)&local_88,(int)uVar8,(QChar)0x0);
      local_70[0] = local_c8;
      local_70[1] = 8;
      local_70[2] = local_c4;
      local_64 = 0x13;
      QPainter::drawText((QRect *)auStack_e8,(int)local_70,(QString *)0x84,pQVar1);
      uVar7 = local_60;
      this = local_b8;
      piVar2 = (int *)CONCAT44(iStack_dc,auStack_e8._8_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(iStack_dc,auStack_e8._8_4_),2,8);
        }
      }
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,8);
        }
      }
      iVar4 = iVar4 + 1 + (int)local_b0;
    } while (uVar8 != 4);
    QPainter::setPen((QPen *)auStack_e8);
    iStack_dc = 0;
    local_d4 = (int)uVar7;
    auStack_e8._8_4_ = iVar4;
    local_d8 = iVar4;
    QPainter::drawLines((QLine *)auStack_e8,(int)auStack_e8 + 8);
    QPen::~QPen(local_a8);
    QPainter::~QPainter((QPainter *)auStack_e8);
  }
  return;
}

Assistant:

void PatternGridHeader::paintEvent(QPaintEvent *evt) {

    Q_UNUSED(evt);

    if (mLayout == nullptr) {
        return;
    }

    QPainter painter(this);
    QPen textPen(mColorForeground1);

    QColor widgetbg = palette().color(backgroundRole());

    auto const h = height();

    int xpos = mLayout->patternStart() - PatternLayout::LINE_WIDTH;
    for (int track = 0; track < 4; ++track) {

        auto const trackWidth = mLayout->trackWidth(track);

        painter.setPen(mLinePen);
        painter.drawLine(xpos, 0, xpos, h);
        xpos += PatternLayout::LINE_WIDTH;

        // background color
        painter.fillRect(xpos + 1, 0, trackWidth - 1, h, mColorBackground);

        bool const isPlaying = (mTrackFlags & (1 << track));
        auto const& statusColor = isPlaying ? mColorEnabled : mColorDisabled;
        auto const contentX = xpos + TU::TRACK_PADDING;
        auto const contentWidth = trackWidth - 5;
        painter.fillRect(contentX, 2, contentWidth, 4, statusColor);

        QColor *plusColor, *minusColor;
        plusColor = minusColor = &mColorForeground1;


        if (mTrackHover == track) {
            painter.fillRect(contentX, h - 2, contentWidth, 1, statusColor);
            switch (mHoverKind) {
                case HoverKind::track:
                    break;
                case HoverKind::addEffect:
                    plusColor = &mColorForeground2;
                    break;
                case HoverKind::removeEffect:
                    minusColor = &mColorForeground2;
                    break;
            }
        }
        
        auto const effectsVisible = mLayout->effectsVisible(track);
        TU::drawPlus(painter, contentX, effectsVisible != 3 ? *plusColor : widgetbg);
        TU::drawMinus(painter, contentX, effectsVisible != 1 ? *minusColor : widgetbg);

        // text
        painter.setPen(textPen);
        constexpr int textY = 8;
        painter.drawText(contentX, textY, contentWidth, 12, Qt::AlignCenter, QStringLiteral("CH%1").arg(track + 1));

        xpos += trackWidth;
    }

    painter.setPen(mLinePen);
    painter.drawLine(xpos, 0, xpos, h);
    

}